

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O1

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
(anonymous_namespace)::PeerManagerImpl::FetchBlock_abi_cxx11_
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,PeerManagerImpl *this,NodeId peer_id,CBlockIndex *block_index)

{
  uint256 *puVar1;
  function<bool_(CNode_*)> func;
  bool bVar2;
  Logger *this_00;
  ulong extraout_RDX;
  long in_FS_OFFSET;
  initializer_list<CInv> __l;
  optional<long> from_peer;
  string_view source_file;
  string_view logging_function;
  code *pcVar3;
  allocator_type local_c9;
  vector<CInv,_std::allocator<CInv>_> invs;
  PeerRef peer;
  NodeId peer_id_local;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock38;
  undefined1 local_88 [48];
  uint256 local_58;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  peer_id_local = peer_id;
  if (((*(byte *)(*(long *)(this + 0x118) + 0x9d0) & 1) != 0) ||
     ((*(byte *)(*(long *)(this + 0x118) + 0x9d1) & 1) == 0)) {
    (__return_storage_ptr__->
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    )._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._M_value._M_dataplus._M_p =
         (pointer)((long)&(__return_storage_ptr__->
                          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                          )._M_payload.
                          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                          .
                          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ._M_payload + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,"Loading blocks ...","");
    (__return_storage_ptr__->
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    )._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_engaged = true;
    goto LAB_008ebd33;
  }
  anon_unknown.dwarf_2ece268::PeerManagerImpl::GetPeerRef((PeerManagerImpl *)&peer,(NodeId)this);
  if (peer.super___shared_ptr<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    (__return_storage_ptr__->
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    )._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._M_value._M_dataplus._M_p =
         (pointer)((long)&(__return_storage_ptr__->
                          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                          )._M_payload.
                          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                          .
                          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ._M_payload + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,"Peer does not exist","");
LAB_008ebd7a:
    (__return_storage_ptr__->
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    )._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_engaged = true;
  }
  else {
    if ((((peer.super___shared_ptr<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
         ->m_their_services)._M_i & NODE_WITNESS) == NODE_NONE) {
      (__return_storage_ptr__->
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      )._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_payload._M_value._M_dataplus._M_p =
           (pointer)((long)&(__return_storage_ptr__->
                            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                            )._M_payload.
                            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                            .
                            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ._M_payload + 0x10);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)__return_storage_ptr__,"Pre-SegWit peer","");
      goto LAB_008ebd7a;
    }
    criticalblock38.super_unique_lock._M_device = &cs_main.super_recursive_mutex;
    criticalblock38.super_unique_lock._M_owns = false;
    std::unique_lock<std::recursive_mutex>::lock(&criticalblock38.super_unique_lock);
    puVar1 = block_index->phashBlock;
    if (puVar1 == (uint256 *)0x0) {
LAB_008ebf9f:
      __assert_fail("phashBlock != nullptr",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/chain.h"
                    ,0xf5,"uint256 CBlockIndex::GetBlockHash() const");
    }
    local_88._0_8_ = *(undefined8 *)(puVar1->super_base_blob<256U>).m_data._M_elems;
    local_88._8_8_ = *(undefined8 *)((puVar1->super_base_blob<256U>).m_data._M_elems + 8);
    local_88._16_8_ = *(undefined8 *)((puVar1->super_base_blob<256U>).m_data._M_elems + 0x10);
    local_88._24_8_ = *(undefined8 *)((puVar1->super_base_blob<256U>).m_data._M_elems + 0x18);
    from_peer.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
    _8_8_ = 0;
    from_peer.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
    _M_payload._M_value = extraout_RDX;
    anon_unknown.dwarf_2ece268::PeerManagerImpl::RemoveBlockRequest
              ((PeerManagerImpl *)this,(uint256 *)local_88,from_peer);
    bVar2 = anon_unknown.dwarf_2ece268::PeerManagerImpl::BlockRequested
                      ((PeerManagerImpl *)this,peer_id_local,block_index,(iterator **)0x0);
    if (bVar2) {
      puVar1 = block_index->phashBlock;
      if (puVar1 == (uint256 *)0x0) goto LAB_008ebf9f;
      local_58.super_base_blob<256U>.m_data._M_elems._0_8_ =
           *(undefined8 *)(puVar1->super_base_blob<256U>).m_data._M_elems;
      local_58.super_base_blob<256U>.m_data._M_elems._8_8_ =
           *(undefined8 *)((puVar1->super_base_blob<256U>).m_data._M_elems + 8);
      local_58.super_base_blob<256U>.m_data._M_elems._16_8_ =
           *(undefined8 *)((puVar1->super_base_blob<256U>).m_data._M_elems + 0x10);
      local_58.super_base_blob<256U>.m_data._M_elems._24_8_ =
           *(undefined8 *)((puVar1->super_base_blob<256U>).m_data._M_elems + 0x18);
      CInv::CInv((CInv *)local_88,0x40000002,&local_58);
      __l._M_len = 1;
      __l._M_array = (iterator)local_88;
      std::vector<CInv,_std::allocator<CInv>_>::vector(&invs,__l,&local_c9);
      pcVar3 = std::
               _Function_handler<bool_(CNode_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp:2054:47)>
               ::_M_manager;
      func.super__Function_base._M_functor._8_8_ = &invs;
      func.super__Function_base._M_functor._M_unused._M_function_pointer = (_func_void *)this;
      func.super__Function_base._M_manager =
           std::
           _Function_handler<bool_(CNode_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp:2054:47)>
           ::_M_manager;
      func._M_invoker =
           std::
           _Function_handler<bool_(CNode_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp:2054:47)>
           ::_M_invoke;
      bVar2 = CConnman::ForNode(*(CConnman **)(this + 0x100),peer_id_local,func);
      if (pcVar3 != (code *)0x0) {
        (*pcVar3)(&stack0xffffffffffffff08,&stack0xffffffffffffff08,3);
      }
      if (bVar2) {
        this_00 = LogInstance();
        bVar2 = BCLog::Logger::WillLogCategoryLevel(this_00,NET,Debug);
        if (bVar2) {
          base_blob<256u>::ToString_abi_cxx11_((string *)local_88,&local_58);
          source_file._M_str =
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
          ;
          source_file._M_len = 0x62;
          logging_function._M_str = "FetchBlock";
          logging_function._M_len = 10;
          LogPrintFormatInternal<std::__cxx11::string,long>
                    (logging_function,source_file,0x80e,NET,Debug,
                     (ConstevalFormatString<2U>)0xf9d430,(string *)local_88,&peer_id_local);
          if ((undefined1 *)local_88._0_8_ != local_88 + 0x10) {
            operator_delete((void *)local_88._0_8_,local_88._16_8_ + 1);
          }
        }
        bVar2 = false;
      }
      else {
        (__return_storage_ptr__->
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        )._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_payload._M_value._M_dataplus._M_p =
             (pointer)((long)&(__return_storage_ptr__->
                              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                              )._M_payload.
                              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                              .
                              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ._M_payload + 0x10);
        bVar2 = true;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)__return_storage_ptr__,"Peer not fully connected","");
      }
      (__return_storage_ptr__->
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      )._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged = bVar2;
      if (invs.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(invs.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)invs.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)invs.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
    }
    else {
      (__return_storage_ptr__->
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      )._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_payload._M_value._M_dataplus._M_p =
           (pointer)((long)&(__return_storage_ptr__->
                            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                            )._M_payload.
                            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                            .
                            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ._M_payload + 0x10);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)__return_storage_ptr__,"Already requested from this peer","");
      (__return_storage_ptr__->
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      )._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged = true;
    }
    std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock38.super_unique_lock);
  }
  if (peer.super___shared_ptr<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (peer.super___shared_ptr<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
LAB_008ebd33:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::string> PeerManagerImpl::FetchBlock(NodeId peer_id, const CBlockIndex& block_index)
{
    if (m_chainman.m_blockman.LoadingBlocks()) return "Loading blocks ...";

    // Ensure this peer exists and hasn't been disconnected
    PeerRef peer = GetPeerRef(peer_id);
    if (peer == nullptr) return "Peer does not exist";

    // Ignore pre-segwit peers
    if (!CanServeWitnesses(*peer)) return "Pre-SegWit peer";

    LOCK(cs_main);

    // Forget about all prior requests
    RemoveBlockRequest(block_index.GetBlockHash(), std::nullopt);

    // Mark block as in-flight
    if (!BlockRequested(peer_id, block_index)) return "Already requested from this peer";

    // Construct message to request the block
    const uint256& hash{block_index.GetBlockHash()};
    std::vector<CInv> invs{CInv(MSG_BLOCK | MSG_WITNESS_FLAG, hash)};

    // Send block request message to the peer
    bool success = m_connman.ForNode(peer_id, [this, &invs](CNode* node) {
        this->MakeAndPushMessage(*node, NetMsgType::GETDATA, invs);
        return true;
    });

    if (!success) return "Peer not fully connected";

    LogDebug(BCLog::NET, "Requesting block %s from peer=%d\n",
                 hash.ToString(), peer_id);
    return std::nullopt;
}